

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1acccd7::Scenario::ReceivedInv
          (Scenario *this,NodeId peer,GenTxid *gtxid,bool pref,microseconds reqtime)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  duration<long,_std::ratio<1L,_1000000L>_> *pdVar2;
  undefined8 *puVar3;
  uchar uVar4;
  long lVar5;
  Runner *pRVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  undefined8 uVar10;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  long *plVar20;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar21;
  pointer ppVar22;
  long lVar23;
  long in_FS_OFFSET;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined1 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar6 = this->m_runner;
  uVar4 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[0x1f];
  uVar10._0_1_ = gtxid->m_is_wtxid;
  uVar10._1_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[0];
  uVar10._2_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[1];
  uVar10._3_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[2];
  uVar11 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[3];
  uVar12 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[4];
  uVar14 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[5];
  uVar16 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[6];
  uVar15 = CONCAT11(uVar16,uVar14);
  uVar13 = CONCAT21(uVar15,uVar12);
  uVar10._4_4_ = CONCAT31(uVar13,uVar11);
  uVar17 = *(undefined8 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 7);
  lVar18 = *(long *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0xf);
  lVar19 = *(long *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x17);
  ppVar7 = (pRVar6->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = (undefined4)uVar10;
  uStack_60 = (undefined4)uVar17;
  uStack_5c = (undefined4)((ulong)uVar17 >> 0x20);
  if (ppVar7 == (pRVar6->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = &pRVar6->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(this_00,1,"vector::_M_realloc_insert");
    ppVar8 = (pRVar6->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (pRVar6->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar23 = (long)ppVar7 - (long)ppVar8 >> 3;
    if (__n == 0) {
      ppVar21 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                 *)0x0;
    }
    else {
      ppVar21 = __gnu_cxx::
                new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                            *)this_00,__n,(void *)0x0);
    }
    pdVar2 = &ppVar21->first + lVar23;
    pdVar2->__r = (this->m_now).__r;
    puVar3 = (undefined8 *)((long)&(ppVar21->second).super__Function_base._M_functor + lVar23 * 8);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    plVar20 = (long *)operator_new(0x40);
    *plVar20 = (long)pRVar6;
    plVar20[1] = peer;
    local_58 = (undefined4)lVar18;
    uStack_54 = (undefined4)((ulong)lVar18 >> 0x20);
    uStack_50 = (undefined4)lVar19;
    uStack_4c = (undefined4)((ulong)lVar19 >> 0x20);
    *(undefined4 *)(plVar20 + 2) = local_68;
    *(undefined4 *)((long)plVar20 + 0x14) = uVar10._4_4_;
    *(undefined4 *)(plVar20 + 3) = uStack_60;
    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_5c;
    *(undefined4 *)(plVar20 + 4) = local_58;
    *(undefined4 *)((long)plVar20 + 0x24) = uStack_54;
    *(undefined4 *)(plVar20 + 5) = uStack_50;
    *(undefined4 *)((long)plVar20 + 0x2c) = uStack_4c;
    *(uchar *)(plVar20 + 6) = uVar4;
    *(bool *)((long)plVar20 + 0x31) = pref;
    plVar20[7] = reqtime.__r;
    *(long **)&(((function<void_()> *)(pdVar2 + 1))->super__Function_base)._M_functor = plVar20;
    pdVar2[4] = (duration<long,_std::ratio<1L,_1000000L>_>)
                _GLOBAL__N_1::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
                ::_M_invoke;
    pdVar2[3] = (duration<long,_std::ratio<1L,_1000000L>_>)
                _GLOBAL__N_1::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
                ::_M_manager;
    ppVar22 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar8,ppVar7,ppVar21,this_00);
    ppVar22 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar7,ppVar9,ppVar22 + 1,this_00);
    if (ppVar8 != (pointer)0x0) {
      operator_delete(ppVar8,(long)(pRVar6->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar8
                     );
    }
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar21;
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar22;
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar21 + __n;
  }
  else {
    (ppVar7->first).__r = (this->m_now).__r;
    *(undefined8 *)&(ppVar7->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar7->second).super__Function_base._M_functor + 8) = 0;
    (ppVar7->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar7->second)._M_invoker = (_Invoker_type)0x0;
    plVar20 = (long *)operator_new(0x40);
    *plVar20 = (long)pRVar6;
    plVar20[1] = peer;
    *(undefined4 *)(plVar20 + 2) = local_68;
    *(undefined4 *)((long)plVar20 + 0x14) = uVar10._4_4_;
    *(undefined4 *)(plVar20 + 3) = uStack_60;
    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_5c;
    plVar20[4] = lVar18;
    plVar20[5] = lVar19;
    *(uchar *)(plVar20 + 6) = uVar4;
    *(bool *)((long)plVar20 + 0x31) = pref;
    plVar20[7] = reqtime.__r;
    *(long **)&(ppVar7->second).super__Function_base._M_functor = plVar20;
    (ppVar7->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_invoke;
    (ppVar7->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_manager;
    pppVar1 = &(pRVar6->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool pref, std::chrono::microseconds reqtime)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedInv(peer, gtxid, pref, reqtime);
            runner.txrequest.SanityCheck();
        });
    }